

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

int class_metadata_attributes_impl_cb_iterate
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long lVar1;
  value *ppvVar2;
  value pvVar3;
  
  ppvVar2 = value_to_array(*args);
  pvVar3 = attribute_metadata((attribute_conflict)val);
  lVar1 = *(long *)((long)args + 8);
  *(long *)((long)args + 8) = lVar1 + 1;
  ppvVar2[lVar1] = pvVar3;
  return 0;
}

Assistant:

int class_metadata_attributes_impl_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	class_metadata_iterator_args iterator = (class_metadata_iterator_args)args;
	value *v_array = value_to_array(iterator->v);

	(void)s;
	(void)key;

	v_array[iterator->count++] = attribute_metadata((attribute)val);

	return 0;
}